

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::~IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x8f4298;
  *(undefined8 *)&this->field_0x38 = 0x8f43b0;
  *(undefined8 *)&this[-1].field_0xd8 = 0x8f42c0;
  *(undefined8 *)&this[-1].field_0xe8 = 0x8f42e8;
  *(undefined8 *)&this[-1].field_0x120 = 0x8f4310;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x8f4338;
  *(undefined8 *)&this[-1].field_0x188 = 0x8f4360;
  *(undefined8 *)this = 0x8f4388;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__008f43d0);
  operator_delete(&this[-1].field_0x50,0x198);
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}